

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O3

Block * __thiscall
wasm::I64ToI32Lowering::lowerShift
          (I64ToI32Lowering *this,BinaryOp op,Block *result,TempVar *leftLow,TempVar *leftHigh,
          TempVar *rightLow,TempVar *rightHigh)

{
  bool bVar1;
  Index IVar2;
  Builder *pBVar3;
  Builder *pBVar4;
  undefined4 uVar5;
  Expression *pEVar6;
  Const *pCVar7;
  Binary *pBVar8;
  Const *pCVar9;
  Binary *pBVar10;
  Block *pBVar11;
  Block *pBVar12;
  If *this_00;
  undefined4 in_register_00000034;
  ulong uVar13;
  optional<wasm::Type> type_;
  Block *local_a0;
  Block *local_98;
  LocalSet *local_90;
  Binary *local_88;
  Const *local_80;
  undefined8 local_78;
  undefined1 local_70 [8];
  TempVar shift;
  
  local_78 = CONCAT44(in_register_00000034,op);
  shift.ty.id = (uintptr_t)leftLow;
  if (2 < op - ShlInt64) {
    __assert_fail("op == ShlInt64 || op == ShrUInt64 || op == ShrSInt64",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                  ,0x4bc,
                  "Block *wasm::I64ToI32Lowering::lowerShift(BinaryOp, Block *, TempVar &&, TempVar &&, TempVar &&, TempVar &&)"
                 );
  }
  getTemp((TempVar *)local_70,this,(Type)0x2);
  uVar5 = local_70._0_4_;
  if (((char)shift.pass != '\x01') && (local_98 = result, rightLow->moved != true)) {
    pBVar3 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    IVar2 = rightLow->idx;
    pEVar6 = (Expression *)MixedArena::allocSpace(&pBVar3->wasm->allocator,0x18,8);
    pEVar6->_id = LocalGetId;
    *(Index *)(pEVar6 + 1) = IVar2;
    (pEVar6->type).id = 2;
    pCVar7 = Builder::makeConst<int>
                       ((this->builder)._M_t.
                        super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                        .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,0x1f);
    pBVar8 = (Binary *)MixedArena::allocSpace(&pBVar3->wasm->allocator,0x28,8);
    (pBVar8->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar8->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar8->op = AndInt32;
    pBVar8->left = pEVar6;
    pBVar8->right = (Expression *)pCVar7;
    Binary::finalize(pBVar8);
    local_90 = Builder::makeLocalSet(pBVar3,uVar5,(Expression *)pBVar8);
    pBVar3 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    pCVar7 = Builder::makeConst<int>(pBVar3,0x20);
    if (rightLow->moved != true) {
      pBVar4 = (this->builder)._M_t.
               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
               super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      IVar2 = rightLow->idx;
      pEVar6 = (Expression *)MixedArena::allocSpace(&pBVar4->wasm->allocator,0x18,8);
      pEVar6->_id = LocalGetId;
      *(Index *)(pEVar6 + 1) = IVar2;
      (pEVar6->type).id = 2;
      pCVar9 = Builder::makeConst<int>
                         ((this->builder)._M_t.
                          super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                          .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,0x3f);
      pBVar8 = (Binary *)MixedArena::allocSpace(&pBVar4->wasm->allocator,0x28,8);
      (pBVar8->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
      (pBVar8->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
      pBVar8->op = AndInt32;
      pBVar8->left = pEVar6;
      pBVar8->right = (Expression *)pCVar9;
      Binary::finalize(pBVar8);
      pBVar10 = (Binary *)MixedArena::allocSpace(&pBVar3->wasm->allocator,0x28,8);
      (pBVar10->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
      (pBVar10->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
      pBVar10->op = LeUInt32;
      pBVar10->left = (Expression *)pCVar7;
      pBVar10->right = (Expression *)pBVar8;
      Binary::finalize(pBVar10);
      bVar1 = rightHigh->moved;
      local_88 = pBVar10;
      if ((int)local_78 == 0x23) {
        if (((bVar1 != false) || (*(char *)(shift.ty.id + 0x10) == '\x01')) ||
           ((char)shift.pass == '\x01')) goto LAB_008db796;
        pBVar11 = makeLargeShl(this,rightHigh->idx,*(Index *)shift.ty.id,local_70._0_4_);
      }
      else if ((int)local_78 == 0x24) {
        if (((bVar1 != false) || (leftHigh->moved == true)) || ((char)shift.pass == '\x01'))
        goto LAB_008db796;
        pBVar11 = makeLargeShrS(this,rightHigh->idx,leftHigh->idx,local_70._0_4_);
      }
      else {
        if (((bVar1 != false) || (leftHigh->moved == true)) || ((char)shift.pass == '\x01'))
        goto LAB_008db796;
        pBVar11 = makeLargeShrU(this,rightHigh->idx,leftHigh->idx,local_70._0_4_);
      }
      pBVar3 = (this->builder)._M_t.
               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
               super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      pCVar7 = Builder::makeConst<int>(pBVar3,1);
      uVar5 = local_70._0_4_;
      if ((char)shift.pass != '\x01') {
        pEVar6 = (Expression *)
                 MixedArena::allocSpace
                           (&((this->builder)._M_t.
                              super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                              .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm->
                             allocator,0x18,8);
        pEVar6->_id = LocalGetId;
        *(undefined4 *)(pEVar6 + 1) = uVar5;
        (pEVar6->type).id = 2;
        pBVar8 = (Binary *)MixedArena::allocSpace(&pBVar3->wasm->allocator,0x28,8);
        (pBVar8->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId
        ;
        (pBVar8->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        pBVar8->op = ShlInt32;
        pBVar8->left = (Expression *)pCVar7;
        pBVar8->right = pEVar6;
        Binary::finalize(pBVar8);
        pCVar7 = Builder::makeConst<int>
                           ((this->builder)._M_t.
                            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                            .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,1);
        pBVar10 = (Binary *)MixedArena::allocSpace(&pBVar3->wasm->allocator,0x28,8);
        (pBVar10->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
             BinaryId;
        (pBVar10->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        pBVar10->op = SubInt32;
        pBVar10->left = (Expression *)pBVar8;
        pBVar10->right = (Expression *)pCVar7;
        Binary::finalize(pBVar10);
        pBVar3 = (this->builder)._M_t.
                 super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                 super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
        local_80 = Builder::makeConst<int>(pBVar3,0x20);
        uVar5 = local_70._0_4_;
        if ((char)shift.pass != '\x01') {
          pEVar6 = (Expression *)
                   MixedArena::allocSpace
                             (&((this->builder)._M_t.
                                super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm->
                               allocator,0x18,8);
          pEVar6->_id = LocalGetId;
          *(undefined4 *)(pEVar6 + 1) = uVar5;
          (pEVar6->type).id = 2;
          pBVar8 = (Binary *)MixedArena::allocSpace(&pBVar3->wasm->allocator,0x28,8);
          (pBVar8->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
               BinaryId;
          (pBVar8->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
          pBVar8->op = SubInt32;
          pBVar8->left = (Expression *)local_80;
          pBVar8->right = pEVar6;
          Binary::finalize(pBVar8);
          bVar1 = rightHigh->moved;
          if ((int)local_78 != 0x23) {
            if ((int)local_78 == 0x24) {
              if (((bVar1 != false) || (*(char *)(shift.ty.id + 0x10) == '\x01')) ||
                 ((leftHigh->moved == true || ((char)shift.pass == '\x01')))) goto LAB_008db796;
              pBVar12 = makeSmallShrS(this,rightHigh->idx,*(Index *)shift.ty.id,leftHigh->idx,
                                      local_70._0_4_,pBVar10,pBVar8);
            }
            else {
              if (((bVar1 != false) || (*(char *)(shift.ty.id + 0x10) == '\x01')) ||
                 ((leftHigh->moved == true || ((char)shift.pass == '\x01')))) goto LAB_008db796;
              pBVar12 = makeSmallShrU(this,rightHigh->idx,*(Index *)shift.ty.id,leftHigh->idx,
                                      local_70._0_4_,pBVar10,pBVar8);
            }
LAB_008db6dc:
            uVar13 = 0x28;
            this_00 = (If *)MixedArena::allocSpace
                                      (&((this->builder)._M_t.
                                         super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                                         .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl
                                        )->wasm->allocator,0x28,8);
            (this_00->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = IfId
            ;
            (this_00->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id =
                 0;
            this_00->condition = (Expression *)local_88;
            this_00->ifTrue = (Expression *)pBVar11;
            this_00->ifFalse = (Expression *)pBVar12;
            type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._8_8_ = 0;
            type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar13
            ;
            If::finalize(this_00,type_);
            pBVar3 = (this->builder)._M_t.
                     super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                     super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
            pBVar11 = Builder::blockify(pBVar3,(Expression *)local_98,(Expression *)local_90);
            pBVar11 = Builder::blockify(pBVar3,(Expression *)pBVar11,(Expression *)this_00);
            local_a0 = pBVar11;
            std::
            _Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<wasm::Expression*&,wasm::I64ToI32Lowering::TempVar>
                      ((_Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&this->highBitVars,&local_a0,rightHigh);
            TempVar::~TempVar((TempVar *)local_70);
            return pBVar11;
          }
          if ((((bVar1 == false) && (*(char *)(shift.ty.id + 0x10) != '\x01')) &&
              (leftHigh->moved != true)) && ((char)shift.pass != '\x01')) {
            pBVar12 = makeSmallShl(this,rightHigh->idx,*(Index *)shift.ty.id,leftHigh->idx,
                                   local_70._0_4_,pBVar10,pBVar8);
            goto LAB_008db6dc;
          }
        }
      }
    }
  }
LAB_008db796:
  __assert_fail("!moved",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                ,0x4f,"Index wasm::I64ToI32Lowering::TempVar::operator unsigned int()");
}

Assistant:

Block* lowerShift(BinaryOp op,
                    Block* result,
                    TempVar&& leftLow,
                    TempVar&& leftHigh,
                    TempVar&& rightLow,
                    TempVar&& rightHigh) {
    assert(op == ShlInt64 || op == ShrUInt64 || op == ShrSInt64);
    // shift left lowered as:
    // if 32 <= rightLow % 64:
    //     high = leftLow << k; low = 0
    // else:
    //     high = (((1 << k) - 1) & (leftLow >> (32 - k))) | (leftHigh << k);
    //     low = leftLow << k
    // where k = shift % 32. shift right is similar.
    TempVar shift = getTemp();
    LocalSet* setShift = builder->makeLocalSet(
      shift,
      builder->makeBinary(AndInt32,
                          builder->makeLocalGet(rightLow, Type::i32),
                          builder->makeConst(int32_t(32 - 1))));
    Binary* isLargeShift = builder->makeBinary(
      LeUInt32,
      builder->makeConst(int32_t(32)),
      builder->makeBinary(AndInt32,
                          builder->makeLocalGet(rightLow, Type::i32),
                          builder->makeConst(int32_t(64 - 1))));
    Block* largeShiftBlock;
    switch (op) {
      case ShlInt64:
        largeShiftBlock = makeLargeShl(rightHigh, leftLow, shift);
        break;
      case ShrSInt64:
        largeShiftBlock = makeLargeShrS(rightHigh, leftHigh, shift);
        break;
      case ShrUInt64:
        largeShiftBlock = makeLargeShrU(rightHigh, leftHigh, shift);
        break;
      default:
        abort();
    }
    Binary* shiftMask = builder->makeBinary(
      SubInt32,
      builder->makeBinary(ShlInt32,
                          builder->makeConst(int32_t(1)),
                          builder->makeLocalGet(shift, Type::i32)),
      builder->makeConst(int32_t(1)));
    Binary* widthLessShift =
      builder->makeBinary(SubInt32,
                          builder->makeConst(int32_t(32)),
                          builder->makeLocalGet(shift, Type::i32));
    Block* smallShiftBlock;
    switch (op) {
      case ShlInt64: {
        smallShiftBlock = makeSmallShl(
          rightHigh, leftLow, leftHigh, shift, shiftMask, widthLessShift);
        break;
      }
      case ShrSInt64: {
        smallShiftBlock = makeSmallShrS(
          rightHigh, leftLow, leftHigh, shift, shiftMask, widthLessShift);
        break;
      }
      case ShrUInt64: {
        smallShiftBlock = makeSmallShrU(
          rightHigh, leftLow, leftHigh, shift, shiftMask, widthLessShift);
        break;
      }
      default:
        abort();
    }
    If* ifLargeShift =
      builder->makeIf(isLargeShift, largeShiftBlock, smallShiftBlock);
    result = builder->blockify(result, setShift, ifLargeShift);
    setOutParam(result, std::move(rightHigh));
    return result;
  }